

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpElementUnsigned1<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data
               ,FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data_local;
  OpCode op_local;
  
  if (((ushort)(op - StArrItemI_CI4) < 2) || (op == StArrInlineItem_CI4 || op == StArrSegItem_CI4))
  {
    Output::Print(L" R%d[",(ulong)data->Instance);
    DumpI4(data->Element);
    Output::Print(L"] = R%d",(ulong)data->Value);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x49b,"(false)","Unknown OpCode for OpLayoutElementUnsigned1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpElementUnsigned1(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::StArrItemC_CI4:
            case OpCode::StArrItemI_CI4:
            case OpCode::StArrSegItem_CI4:
            case OpCode::StArrInlineItem_CI4:
                Output::Print(_u(" R%d["), data->Instance);
                DumpI4(data->Element);
                Output::Print(_u("] = R%d"), data->Value);
                break;
            default:
                AssertMsg(false, "Unknown OpCode for OpLayoutElementUnsigned1");
                break;
        }
    }